

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

ptrdiff_t toml::detail::check_utf8_validity(string *reg)

{
  ptrdiff_t pVar1;
  location loc;
  result<toml::detail::region,_toml::detail::none_t> u8;
  string local_d0;
  location local_b0;
  result<toml::detail::region,_toml::detail::none_t> local_68;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"tmp","");
  location::location(&local_b0,&local_d0,reg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  repeat<toml::detail::either<toml::detail::in_range<'\x00',_'\x7f'>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>
  ::invoke(&local_68,&local_b0);
  if ((local_68.is_ok_ == true) &&
     (local_b0.iter_._M_current ==
      ((local_b0.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    pVar1 = -1;
  }
  else {
    pVar1 = (long)local_b0.iter_._M_current -
            (long)((local_b0.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (pVar1 < 0) {
      __assert_fail("0 <= error_location",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/parser.hpp"
                    ,0x1ca,"std::ptrdiff_t toml::detail::check_utf8_validity(const std::string &)");
    }
  }
  if (local_68.is_ok_ != false) {
    region::~region(&local_68.field_1.succ.value);
  }
  location::~location(&local_b0);
  return pVar1;
}

Assistant:

inline std::ptrdiff_t check_utf8_validity(const std::string& reg)
{
    location loc("tmp", reg);
    const auto u8 = repeat<lex_utf8_code, unlimited>::invoke(loc);
    if(!u8 || loc.iter() != loc.end())
    {
        const auto error_location = std::distance(loc.begin(), loc.iter());
        assert(0 <= error_location);
        return error_location;
    }
    return -1;
}